

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QCommonListViewBase::updateHorizontalScrollBar(QCommonListViewBase *this,QSize *step)

{
  long lVar1;
  bool bVar2;
  int min;
  ScrollBarPolicy SVar3;
  int max;
  int iVar4;
  int iVar5;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool horizontalWantsToShow;
  bool verticalWantsToShow;
  bool bothScrollBarsAuto;
  QSize viewportSize;
  int in_stack_ffffffffffffff9c;
  QAbstractSliderPrivate *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  horizontalScrollBar((QCommonListViewBase *)0x880a2f);
  QScrollBar::d_func((QScrollBar *)0x880a37);
  min = QSize::width((QSize *)0x880a46);
  spacing((QCommonListViewBase *)0x880a54);
  QAbstractSliderPrivate::itemviewChangeSingleStep
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  horizontalScrollBar((QCommonListViewBase *)0x880a6e);
  viewport(in_RDI);
  QWidget::width((QWidget *)0x880a85);
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  SVar3 = QAbstractScrollArea::verticalScrollBarPolicy
                    ((QAbstractScrollArea *)in_stack_ffffffffffffffa0);
  bVar6 = false;
  if (SVar3 == ScrollBarAsNeeded) {
    SVar3 = QAbstractScrollArea::horizontalScrollBarPolicy
                      ((QAbstractScrollArea *)in_stack_ffffffffffffffa0);
    bVar6 = SVar3 == ScrollBarAsNeeded;
  }
  QListModeViewBase::viewportSize((QAbstractItemView *)in_stack_ffffffffffffffa0);
  max = QSize::height((QSize *)0x880afc);
  iVar4 = QSize::height((QSize *)0x880b0a);
  if (iVar4 < max) {
    in_stack_ffffffffffffffb4 = QSize::width((QSize *)0x880b35);
    in_stack_ffffffffffffffb0 = QSize::width((QSize *)0x880b43);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffffa0);
    iVar4 = QWidget::width((QWidget *)0x880b5f);
    bVar2 = in_stack_ffffffffffffffb0 - iVar4 < in_stack_ffffffffffffffb4;
  }
  else {
    iVar4 = QSize::width((QSize *)0x880b86);
    iVar5 = QSize::width((QSize *)0x880b94);
    bVar2 = iVar5 < iVar4;
  }
  if ((!bVar6) || (bVar2)) {
    horizontalScrollBar((QCommonListViewBase *)0x880bd5);
    QSize::width((QSize *)0x880be8);
    viewport(in_RDI);
    QWidget::width((QWidget *)0x880bfe);
    QAbstractSlider::setRange
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),min,
               max);
  }
  else {
    horizontalScrollBar((QCommonListViewBase *)0x880bbd);
    QAbstractSlider::setRange
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),min,
               max);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCommonListViewBase::updateHorizontalScrollBar(const QSize &step)
{
    horizontalScrollBar()->d_func()->itemviewChangeSingleStep(step.width() + spacing());
    horizontalScrollBar()->setPageStep(viewport()->width());

    // If both scroll bars are set to auto, we might end up in a situation with enough space
    // for the actual content. But still one of the scroll bars will become enabled due to
    // the other one using the space. The other one will become invisible in the same cycle.
    // -> Infinite loop, QTBUG-39902
    const bool bothScrollBarsAuto = qq->verticalScrollBarPolicy() == Qt::ScrollBarAsNeeded &&
                                    qq->horizontalScrollBarPolicy() == Qt::ScrollBarAsNeeded;

    const QSize viewportSize = QListModeViewBase::viewportSize(qq);

    bool verticalWantsToShow = contentsSize.height() > viewportSize.height();
    bool horizontalWantsToShow;
    if (verticalWantsToShow)
        horizontalWantsToShow = contentsSize.width() > viewportSize.width() - qq->verticalScrollBar()->width();
    else
        horizontalWantsToShow = contentsSize.width() > viewportSize.width();

    if (bothScrollBarsAuto && !horizontalWantsToShow) {
        // break the infinite loop described above by setting the range to 0, 0.
        // QAbstractScrollArea will then hide the scroll bar for us
        horizontalScrollBar()->setRange(0, 0);
    } else {
        horizontalScrollBar()->setRange(0, contentsSize.width() - viewport()->width());
    }
}